

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor::SerializeWithCachedSizes
          (BayesianProbitRegressor *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  int iVar4;
  BayesianProbitRegressor_FeatureWeight *value;
  long lVar5;
  char *pcVar6;
  string *psVar7;
  uint local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  BayesianProbitRegressor *this_local;
  
  uVar2 = numberoffeatures(this);
  if (uVar2 != 0) {
    uVar2 = numberoffeatures(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,uVar2,output);
  }
  bVar1 = has_bias(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->bias_->super_MessageLite,output);
  }
  local_20 = 0;
  uVar3 = features_size(this);
  for (; local_20 < uVar3; local_20 = local_20 + 1) {
    value = features(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(3,&value->super_MessageLite,output);
  }
  regressioninputfeaturename_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    regressioninputfeaturename_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    regressioninputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar6,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName");
    psVar7 = regressioninputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(10,psVar7,output);
  }
  optimisminputfeaturename_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    optimisminputfeaturename_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    optimisminputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar6,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName");
    psVar7 = optimisminputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xb,psVar7,output);
  }
  samplingscaleinputfeaturename_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    samplingscaleinputfeaturename_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    samplingscaleinputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar6,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName");
    psVar7 = samplingscaleinputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xc,psVar7,output);
  }
  samplingtruncationinputfeaturename_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    samplingtruncationinputfeaturename_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    samplingtruncationinputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar6,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName");
    psVar7 = samplingtruncationinputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xd,psVar7,output);
  }
  meanoutputfeaturename_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    meanoutputfeaturename_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    meanoutputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar6,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName");
    psVar7 = meanoutputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x14,psVar7,output);
  }
  varianceoutputfeaturename_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    varianceoutputfeaturename_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    varianceoutputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar6,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName");
    psVar7 = varianceoutputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x15,psVar7,output);
  }
  pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar6,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName"
              );
    psVar7 = pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x16,psVar7,output);
  }
  sampledprobabilityoutputfeaturename_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    sampledprobabilityoutputfeaturename_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    sampledprobabilityoutputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar6,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName");
    psVar7 = sampledprobabilityoutputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x17,psVar7,output);
  }
  return;
}

Assistant:

void BayesianProbitRegressor::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BayesianProbitRegressor)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 numberOfFeatures = 1;
  if (this->numberoffeatures() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->numberoffeatures(), output);
  }

  // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->bias_, output);
  }

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
  for (unsigned int i = 0, n = this->features_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, this->features(i), output);
  }

  // string regressionInputFeatureName = 10;
  if (this->regressioninputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->regressioninputfeaturename().data(), this->regressioninputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      10, this->regressioninputfeaturename(), output);
  }

  // string optimismInputFeatureName = 11;
  if (this->optimisminputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->optimisminputfeaturename().data(), this->optimisminputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      11, this->optimisminputfeaturename(), output);
  }

  // string samplingScaleInputFeatureName = 12;
  if (this->samplingscaleinputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->samplingscaleinputfeaturename().data(), this->samplingscaleinputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      12, this->samplingscaleinputfeaturename(), output);
  }

  // string samplingTruncationInputFeatureName = 13;
  if (this->samplingtruncationinputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->samplingtruncationinputfeaturename().data(), this->samplingtruncationinputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      13, this->samplingtruncationinputfeaturename(), output);
  }

  // string meanOutputFeatureName = 20;
  if (this->meanoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->meanoutputfeaturename().data(), this->meanoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      20, this->meanoutputfeaturename(), output);
  }

  // string varianceOutputFeatureName = 21;
  if (this->varianceoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->varianceoutputfeaturename().data(), this->varianceoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      21, this->varianceoutputfeaturename(), output);
  }

  // string pessimisticProbabilityOutputFeatureName = 22;
  if (this->pessimisticprobabilityoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->pessimisticprobabilityoutputfeaturename().data(), this->pessimisticprobabilityoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      22, this->pessimisticprobabilityoutputfeaturename(), output);
  }

  // string sampledProbabilityOutputFeatureName = 23;
  if (this->sampledprobabilityoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->sampledprobabilityoutputfeaturename().data(), this->sampledprobabilityoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      23, this->sampledprobabilityoutputfeaturename(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BayesianProbitRegressor)
}